

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

QVariant * __thiscall
QSqlTableModel::headerData(QSqlTableModel *this,int section,Orientation orientation,int role)

{
  Op OVar1;
  int in_ECX;
  int *in_RSI;
  ModifiedRow *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  Op op;
  QSqlTableModelPrivate *d;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ModifiedRow *this_00;
  undefined1 in_stack_ffffffffffffff60 [16];
  QLatin1String *local_90;
  int in_stack_ffffffffffffffac;
  ModifiedRow local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QSqlTableModel *)0x16d76f);
  if ((in_ECX == 2) && (in_R8D == 0)) {
    QSqlRecord::QSqlRecord
              ((QSqlRecord *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    QSqlTableModelPrivate::ModifiedRow::ModifiedRow
              (this_00,(Op)((ulong)in_RDI >> 0x20),
               (QSqlRecord *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
              (in_stack_ffffffffffffff60._0_8_,in_RSI,this_00);
    OVar1 = QSqlTableModelPrivate::ModifiedRow::op(&local_28);
    QSqlTableModelPrivate::ModifiedRow::~ModifiedRow
              ((ModifiedRow *)CONCAT44(OVar1,in_stack_ffffffffffffff40));
    QSqlTableModelPrivate::ModifiedRow::~ModifiedRow
              ((ModifiedRow *)CONCAT44(OVar1,in_stack_ffffffffffffff40));
    QSqlRecord::~QSqlRecord((QSqlRecord *)0x16d80a);
    if (OVar1 == Insert) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_RDI,CONCAT44(1,in_stack_ffffffffffffff40));
      local_90 = (QLatin1String *)QVar2.m_size;
      QVariant::QVariant((QVariant *)in_RDI,local_90);
      goto LAB_0016d8a2;
    }
    if (OVar1 == Delete) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_RDI,CONCAT44(3,in_stack_ffffffffffffff40));
      QVariant::QVariant((QVariant *)in_RDI,(QLatin1String *)QVar2.m_size);
      goto LAB_0016d8a2;
    }
  }
  QSqlQueryModel::headerData
            (in_stack_ffffffffffffff60._8_8_,in_stack_ffffffffffffff60._4_4_,
             in_stack_ffffffffffffff60._0_4_,in_stack_ffffffffffffffac);
LAB_0016d8a2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QVariant *)this_00;
}

Assistant:

QVariant QSqlTableModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    Q_D(const QSqlTableModel);
    if (orientation == Qt::Vertical && role == Qt::DisplayRole) {
        const QSqlTableModelPrivate::Op op = d->cache.value(section).op();
        if (op == QSqlTableModelPrivate::Insert)
            return "*"_L1;
        else if (op == QSqlTableModelPrivate::Delete)
            return "!"_L1;
    }
    return QSqlQueryModel::headerData(section, orientation, role);
}